

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

void __thiscall
VW::config::typed_option<bool>::typed_option(typed_option<bool> *this,typed_option<bool> *param_2)

{
  shared_ptr<bool> *in_RSI;
  shared_ptr<bool> *in_RDI;
  
  config::base_option::base_option(&this->super_base_option,&param_2->super_base_option);
  (in_RDI->super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__typed_option_0048ab50;
  in_RDI[7].super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RSI[7].super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  std::shared_ptr<bool>::shared_ptr(in_RSI,in_RDI);
  std::shared_ptr<bool>::shared_ptr(in_RSI,in_RDI);
  return;
}

Assistant:

typed_option(const std::string& name, T& location) : base_option(name, typeid(T).hash_code()), m_location{location} {}